

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

bool __thiscall QGraphicsProxyWidget::event(QGraphicsProxyWidget *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  QGraphicsProxyWidgetPrivate *this_00;
  QWidgetPrivate *pQVar7;
  QWidget *pQVar8;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  QEvent *in_RSI;
  QEvent *pQVar9;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool res_1;
  QTouchEvent *touchEvent;
  QGraphicsSceneHelpEvent *he;
  bool res;
  QKeyEvent *k;
  QWidget *focusWidget;
  int mask_1;
  QWidgetPrivate *wd_1;
  int mask;
  QWidgetPrivate *wd;
  QGraphicsProxyWidgetPrivate *d;
  QHelpEvent e;
  QPoint pos;
  QWidget *focusWidget_1;
  QPointer<QWidget> *in_stack_fffffffffffffeb8;
  enum_type in_stack_fffffffffffffec0;
  enum_type in_stack_fffffffffffffec4;
  QFlagsStorage<Qt::KeyboardModifier> other;
  QWidgetPrivate *in_stack_fffffffffffffec8;
  QGraphicsItem *in_stack_fffffffffffffed0;
  QPointF *pos_00;
  QWidgetPrivate *in_stack_fffffffffffffed8;
  QPointF *in_stack_fffffffffffffee0;
  QGraphicsItem *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  QWidget *local_d8;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QWidget *in_stack_ffffffffffffff38;
  bool local_91;
  QPoint local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QPointF local_50;
  QPointF local_40;
  QPointF local_30;
  QPoint local_20;
  QWidget *local_18;
  undefined4 local_10;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsProxyWidget *)0x9bb25e);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bb27a);
  if (!bVar1) {
    local_91 = QGraphicsWidget::event
                         ((QWindow *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (QEvent *)in_RDI);
    goto LAB_009bba19;
  }
  TVar3 = QEvent::type(in_RSI);
  __addr_len = (socklen_t *)(ulong)TVar3;
  if (TVar3 == KeyPress) {
    iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
    other.i = (Int)in_stack_fffffffffffffec8;
    if ((iVar6 == 0x1000001) || (iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI), iVar6 == 0x1000002)) {
      local_10 = QKeyEvent::modifiers();
      Qt::operator|(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0);
      local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (QFlags<Qt::KeyboardModifier>)other.i);
      bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
      if (bVar1) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb646);
        local_18 = QWidget::focusWidget((QWidget *)0x9bb64e);
        while (local_18 != (QWidget *)0x0) {
          pQVar9 = in_RSI;
          bVar2 = QCoreApplication::sendEvent(&local_18->super_QObject,in_RSI);
          iVar6 = (int)pQVar9;
          if (((bVar2 & 1) != 0) &&
             (bVar1 = QEvent::isAccepted(in_RSI), __addr = extraout_RDX, bVar1)) {
LAB_009bb6ce:
            QEvent::accept(in_RSI,iVar6,__addr,__addr_len);
            break;
          }
          bVar1 = QGraphicsItem::isWindow(in_stack_fffffffffffffed0);
          if (bVar1) {
            iVar6 = (int)this_00 + 0x208;
            bVar1 = ::operator==((QWidget **)
                                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                 in_stack_fffffffffffffeb8);
            __addr = extraout_RDX_00;
            if (bVar1) goto LAB_009bb6ce;
          }
          local_18 = QWidget::parentWidget((QWidget *)0x9bb6ea);
        }
        local_91 = true;
        goto LAB_009bba19;
      }
    }
  }
  else if (TVar3 - WindowActivate < 2) {
    pQVar8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bb362);
    QCoreApplication::sendEvent(&pQVar8->super_QObject,in_RSI);
  }
  else if (TVar3 == PaletteChange) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb492);
    pQVar7 = QWidget::d_func((QWidget *)0x9bb49a);
    uVar5 = QPalette::resolveMask();
    pQVar7->inheritedPaletteResolveMask =
         (long)(int)(uVar5 | (this_00->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
    QWidgetPrivate::resolvePalette(in_stack_fffffffffffffec8);
  }
  else {
    if (TVar3 == ShortcutOverride) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb548);
      local_d8 = QWidget::focusWidget((QWidget *)0x9bb550);
      while (local_d8 != (QWidget *)0x0) {
        QCoreApplication::sendEvent(&local_d8->super_QObject,in_RSI);
        bVar1 = QEvent::isAccepted(in_RSI);
        if (bVar1) {
          local_91 = true;
          goto LAB_009bba19;
        }
        local_d8 = QWidget::parentWidget((QWidget *)0x9bb599);
      }
      local_91 = false;
      goto LAB_009bba19;
    }
    if (TVar3 == InputMethod) {
      (**(code **)(*(long *)in_RDI + 0x1c8))(in_RDI,in_RSI);
      bVar1 = QEvent::isAccepted(in_RSI);
      if (bVar1) {
        local_91 = true;
      }
      else {
        local_91 = false;
      }
      goto LAB_009bba19;
    }
    if (TVar3 == FontChange) {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb41e);
      pQVar7 = QWidget::d_func((QWidget *)0x9bb426);
      uVar4 = QFont::resolveMask(&(this_00->super_QGraphicsWidgetPrivate).font);
      pQVar7->inheritedFontResolveMask =
           uVar4 | (this_00->super_QGraphicsWidgetPrivate).inheritedFontResolveMask;
      QWidgetPrivate::resolveFont(in_stack_fffffffffffffed8);
    }
    else if (TVar3 == StyleChange) {
      if ((*(ushort *)&this_00->field_0x244 >> 8 & 3) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xfcff | 0x100;
        pQVar8 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb3ca);
        QGraphicsWidget::style((QGraphicsWidget *)in_stack_fffffffffffffec8);
        QWidget::setStyle((QWidget *)CONCAT44(TVar3,in_stack_fffffffffffffef0),(QStyle *)pQVar8);
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xfcff;
      }
    }
    else if (TVar3 == GraphicsSceneHelp) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bb71f);
      if (bVar1) {
        local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        pos_00 = (QPointF *)&in_RDI->super_QPaintDevice;
        local_50 = QGraphicsSceneHelpEvent::scenePos
                             ((QGraphicsSceneHelpEvent *)in_stack_fffffffffffffec8);
        local_40 = QGraphicsItem::mapFromScene(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bb7b3);
        local_30 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,pos_00,in_RDI);
        local_20 = QPointF::toPoint(pos_00);
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = QGraphicsSceneHelpEvent::screenPos
                             ((QGraphicsSceneHelpEvent *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        QHelpEvent::QHelpEvent
                  ((QHelpEvent *)&local_70,ToolTip,(QPoint *)&local_20,(QPoint *)&local_78);
        pQVar8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bb873);
        QCoreApplication::sendEvent(&pQVar8->super_QObject,(QEvent *)&local_70);
        bVar1 = QEvent::isAccepted((QEvent *)&local_70);
        (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
        local_91 = QEvent::isAccepted((QEvent *)&local_70);
        QHelpEvent::~QHelpEvent((QHelpEvent *)&local_70);
        goto LAB_009bba19;
      }
    }
    else if (TVar3 == ToolTipChange) {
      if ((*(ushort *)&this_00->field_0x244 >> 0xc & 3) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xcfff | 0x1000;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bb937);
        QGraphicsItem::toolTip(in_stack_fffffffffffffed0);
        QWidget::setToolTip((QWidget *)in_stack_fffffffffffffed8,
                            (QString *)in_stack_fffffffffffffed0);
        QString::~QString((QString *)0x9bb971);
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xcfff;
      }
    }
    else if (TVar3 - TouchBegin < 3) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bb9b3);
      in_stack_ffffffffffffff07 =
           QApplicationPrivate::translateRawTouchEvent
                     (in_stack_ffffffffffffff38,
                      (QTouchEvent *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      uVar5 = (uint)(byte)in_stack_ffffffffffffff07;
      bVar1 = QEvent::isAccepted(in_RSI);
      if ((uVar5 & bVar1) != 0) {
        local_91 = true;
        goto LAB_009bba19;
      }
    }
  }
  local_91 = QGraphicsWidget::event
                       ((QWindow *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                        (QEvent *)in_RDI);
LAB_009bba19:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool QGraphicsProxyWidget::event(QEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget)
        return QGraphicsWidget::event(event);

    switch (event->type()) {
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        QCoreApplication::sendEvent(d->widget, event);
        break;
    case QEvent::StyleChange:
        // Propagate style changes to the embedded widget.
        if (!d->styleChangeMode) {
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setStyle(style());
            d->styleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    case QEvent::FontChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->font.resolveMask() | d->inheritedFontResolveMask;
        wd->inheritedFontResolveMask = mask;
        wd->resolveFont();
        break;
    }
    case QEvent::PaletteChange: {
        // Propagate to widget.
        QWidgetPrivate *wd = d->widget->d_func();
        int mask = d->palette.resolveMask() | d->inheritedPaletteResolveMask;
        wd->inheritedPaletteResolveMask = mask;
        wd->resolvePalette();
        break;
    }
    case QEvent::InputMethod: {
        inputMethodEvent(static_cast<QInputMethodEvent *>(event));
        if (event->isAccepted())
            return true;
        return false;
    }
    case QEvent::ShortcutOverride: {
        QWidget *focusWidget = d->widget->focusWidget();
        while (focusWidget) {
            QCoreApplication::sendEvent(focusWidget, event);
            if (event->isAccepted())
                return true;
            focusWidget = focusWidget->parentWidget();
        }
        return false;
    }
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent *>(event);
        if (k->key() == Qt::Key_Tab || k->key() == Qt::Key_Backtab) {
            if (!(k->modifiers() & (Qt::ControlModifier | Qt::AltModifier))) {  //### Add MetaModifier?
                QWidget *focusWidget = d->widget->focusWidget();
                while (focusWidget) {
                    const bool res = QCoreApplication::sendEvent(focusWidget, event);
                    if ((res && event->isAccepted()) || (isWindow() && focusWidget == d->widget)) {
                        event->accept();
                        break;
                    }
                    focusWidget = focusWidget->parentWidget();
                }
                return true;
            }
        }
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::GraphicsSceneHelp: {
        // Propagate the help event (for tooltip) to the widget under mouse
        if (d->lastWidgetUnderMouse) {
            QGraphicsSceneHelpEvent *he = static_cast<QGraphicsSceneHelpEvent *>(event);
            QPoint pos = d->mapToReceiver(mapFromScene(he->scenePos()), d->lastWidgetUnderMouse).toPoint();
            QHelpEvent e(QEvent::ToolTip, pos, he->screenPos());
            QCoreApplication::sendEvent(d->lastWidgetUnderMouse, &e);
            event->setAccepted(e.isAccepted());
            return e.isAccepted();
        }
        break;
    }
    case QEvent::ToolTipChange: {
        // Propagate tooltip change to the widget
        if (!d->tooltipChangeMode) {
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::ProxyToWidgetMode;
            d->widget->setToolTip(toolTip());
            d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
        }
        break;
    }
#endif
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd: {
        QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
        bool res = QApplicationPrivate::translateRawTouchEvent(d->widget, touchEvent);
        if (res & touchEvent->isAccepted())
            return true;

        break;
    }
    default:
        break;
    }
    return QGraphicsWidget::event(event);
}